

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaLinCon.cpp
# Opt level: O0

void __thiscall NaLinearUnit::NaLinearUnit(NaLinearUnit *this)

{
  NaConfigPart *in_RDI;
  char *in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffe8;
  uint in_stack_ffffffffffffffec;
  NaUnit *in_stack_fffffffffffffff0;
  
  NaUnit::NaUnit(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,
                 (uint)((ulong)in_RDI >> 0x20));
  NaConfigPart::NaConfigPart(in_RDI,in_stack_ffffffffffffffd8);
  in_RDI->_vptr_NaConfigPart = (_func_int **)&PTR_PrintLog_00194378;
  in_RDI[1]._vptr_NaConfigPart = (_func_int **)&PTR__NaLinearUnit_001943f8;
  NaDynAr<double>::NaDynAr((NaDynAr<double> *)&in_RDI[3].szTypeName);
  *(undefined1 *)&in_RDI[2]._vptr_NaConfigPart = 0;
  *(undefined4 *)((long)&in_RDI[2]._vptr_NaConfigPart + 4) = 0;
  in_RDI[2].szTypeName = (char *)0x3ff0000000000000;
  in_RDI[2].szInstanceName = (char *)0x0;
  in_RDI[2].pSelfData = (void *)0x0;
  in_RDI[3]._vptr_NaConfigPart = (_func_int **)0x0;
  return;
}

Assistant:

NaLinearUnit::NaLinearUnit ()
:   NaConfigPart("LinearUnit")
{
    act = false;
    kind = lckGain;
    K = 1.0;
    T = 0.0;
    Rho = 0.0;
    Tau = 0.0;
}